

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O2

void MapOptHandler_PrecacheSounds(FMapInfoParser *parse,level_info_t *info)

{
  bool bVar1;
  FSoundID snd;
  FSoundID local_2c;
  
  FMapInfoParser::ParseAssign(parse);
  do {
    FScanner::MustGetString(&parse->sc);
    local_2c.ID = S_FindSound((parse->sc).String);
    if (local_2c.ID == 0) {
      FScanner::ScriptMessage(&parse->sc,"Unknown sound \"%s\"",(parse->sc).String);
    }
    else {
      TArray<FSoundID,_FSoundID>::Push(&info->PrecacheSounds,&local_2c);
    }
    bVar1 = FScanner::CheckString(&parse->sc,",");
  } while (bVar1);
  return;
}

Assistant:

DEFINE_MAP_OPTION(PrecacheSounds, true)
{
	parse.ParseAssign();

	do
	{
		parse.sc.MustGetString();
		FSoundID snd = parse.sc.String;
		if (snd == 0)
		{
			parse.sc.ScriptMessage("Unknown sound \"%s\"", parse.sc.String);
		}
		else
		{
			info->PrecacheSounds.Push(snd);
		}
	} while (parse.sc.CheckString(","));
}